

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O2

int X509V3_EXT_add_nconf_sk(CONF *conf,X509V3_CTX *ctx,char *section,stack_st_X509_EXTENSION **sk)

{
  OPENSSL_STACK *sk_00;
  size_t sVar1;
  void *pvVar2;
  X509_EXTENSION *a;
  stack_st_X509_EXTENSION *psVar3;
  uint uVar4;
  ulong i;
  
  sk_00 = (OPENSSL_STACK *)NCONF_get_section(conf,section);
  if (sk_00 == (OPENSSL_STACK *)0x0) {
    uVar4 = 0;
  }
  else {
    for (i = 0; sVar1 = OPENSSL_sk_num(sk_00), i < sVar1; i = i + 1) {
      pvVar2 = OPENSSL_sk_value(sk_00,i);
      a = X509V3_EXT_nconf(conf,ctx,*(char **)((long)pvVar2 + 8),*(char **)((long)pvVar2 + 0x10));
      if (a == (X509_EXTENSION *)0x0) {
        X509_EXTENSION_free((X509_EXTENSION *)0x0);
        return 0;
      }
      if (sk == (stack_st_X509_EXTENSION **)0x0) {
        X509_EXTENSION_free(a);
      }
      else {
        psVar3 = X509v3_add_ext(sk,a,-1);
        X509_EXTENSION_free(a);
        if (psVar3 == (stack_st_X509_EXTENSION *)0x0) break;
      }
    }
    uVar4 = (uint)(sVar1 <= i);
  }
  return uVar4;
}

Assistant:

int X509V3_EXT_add_nconf_sk(const CONF *conf, const X509V3_CTX *ctx,
                            const char *section,
                            STACK_OF(X509_EXTENSION) **sk) {
  const STACK_OF(CONF_VALUE) *nval = NCONF_get_section(conf, section);
  if (nval == NULL) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    X509_EXTENSION *ext = X509V3_EXT_nconf(conf, ctx, val->name, val->value);
    int ok = ext != NULL &&  //
             (sk == NULL || X509v3_add_ext(sk, ext, -1) != NULL);
    X509_EXTENSION_free(ext);
    if (!ok) {
      return 0;
    }
  }
  return 1;
}